

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFLogger.cc
# Opt level: O1

void __thiscall QPDFLogger::Members::Members(Members *this)

{
  Pipeline *next;
  element_type *this_00;
  Pl_OStream *pPVar1;
  Pipeline *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  logic_error *this_02;
  
  this_00 = (element_type *)operator_new(0x30);
  Pl_Discard::Pl_Discard((Pl_Discard *)this_00);
  (this->p_discard).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Pl_Discard*>
            (&(this->p_discard).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ,(Pl_Discard *)this_00);
  pPVar1 = (Pl_OStream *)operator_new(0x38);
  Pl_OStream::Pl_OStream(pPVar1,"standard output",(ostream *)&std::cout);
  (this->p_real_stdout).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pPVar1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Pl_OStream*>
            (&(this->p_real_stdout).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,pPVar1);
  this_01 = (Pipeline *)operator_new(0x38);
  next = (this->p_real_stdout).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  Pipeline::Pipeline(this_01,"track stdout",next);
  this_01->_vptr_Pipeline = (_func_int **)&PTR__Pipeline_002f14f8;
  *(undefined1 *)&this_01[1]._vptr_Pipeline = 0;
  if (next != (Pipeline *)0x0) {
    (this->p_stdout).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_01;
    (this->p_stdout).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
    p_Var2->_M_use_count = 1;
    p_Var2->_M_weak_count = 1;
    p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_base_002f1528;
    p_Var2[1]._vptr__Sp_counted_base = (_func_int **)this_01;
    (this->p_stdout).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         p_Var2;
    pPVar1 = (Pl_OStream *)operator_new(0x38);
    Pl_OStream::Pl_OStream(pPVar1,"standard error",(ostream *)&std::cerr);
    (this->p_stderr).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)pPVar1;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Pl_OStream*>
              (&(this->p_stderr).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,pPVar1);
    p_Var2 = (this->p_stdout).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    (this->p_info).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->p_stdout).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (this->p_info).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         p_Var2;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
    (this->p_warn).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->p_warn).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var2 = (this->p_stderr).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    (this->p_error).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->p_stderr).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (this->p_error).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         p_Var2;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
    (this->p_save).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->p_save).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    return;
  }
  this_02 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_02,"Attempt to create Pl_Track with nullptr as next");
  __cxa_throw(this_02,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

QPDFLogger::Members::Members() :
    p_discard(new Pl_Discard()),
    p_real_stdout(new Pl_OStream("standard output", std::cout)),
    p_stdout(new Pl_Track("track stdout", p_real_stdout.get())),
    p_stderr(new Pl_OStream("standard error", std::cerr)),
    p_info(p_stdout),
    p_warn(nullptr),
    p_error(p_stderr),
    p_save(nullptr)
{
}